

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_util.c
# Opt level: O1

timeval tvrealnow(void)

{
  timeval now;
  timeval local_18;
  
  gettimeofday((timeval *)&local_18,(__timezone_ptr_t)0x0);
  return local_18;
}

Assistant:

struct timeval tvrealnow(void)
{
  struct timeval now;
#ifdef HAVE_GETTIMEOFDAY
  (void)gettimeofday(&now, NULL);
#else
  now.tv_sec = time(NULL);
  now.tv_usec = 0;
#endif
  return now;
}